

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::LayoutBindingBaseCase::buildUniformName
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,String *var)

{
  ostringstream local_198 [8];
  ostringstream s;
  String *var_local;
  LayoutBindingBaseCase *this_local;
  
  s._368_8_ = var;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,(string *)s._368_8_);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

virtual String buildUniformName(String& var)
	{
		std::ostringstream s;
		s << var;
		return s.str();
	}